

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O3

void __thiscall
google::protobuf::internal::WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
          (WireFormatTest<proto2_unittest::TestAllTypes> *this,string *test_case,string *data)

{
  bool bVar1;
  internal iVar2;
  MessageLite *pMVar3;
  Message *this_00;
  FieldDescriptor *field;
  char *in_R9;
  pointer *__ptr;
  char *pcVar4;
  Metadata MVar5;
  Metadata MVar6;
  string_view data_00;
  string_view data_01;
  string_view name;
  ScopedTrace gtest_trace_82;
  TestMessageSet message_set_1;
  TestMessageSet message_set;
  AssertHelper local_e0;
  ScopedTrace local_d1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  InternalMetadata IStack_90;
  anon_union_32_1_493b367e_for_TestMessageSet_3 local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [40];
  int local_30;
  DescriptorPool *local_28;
  MessageFactory *pMStack_20;
  
  testing::ScopedTrace::ScopedTrace
            (&local_d1,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
             ,0x52,test_case);
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet
            ((TestMessageSet *)local_68,(Arena *)0x0);
  data_00._M_str = (data->_M_dataplus)._M_p;
  data_00._M_len = data->_M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)local_68,data_00);
  local_c0[0] = (internal)bVar1;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_c0,
               (AssertionResult *)"message_set.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x55,(char *)local_98);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_98 != (undefined1  [8])&local_88) {
      operator_delete((void *)local_98,
                      (ulong)((long)&((local_88._impl_._extensions_.arena_)->impl_).tag_and_id_ + 1)
                     );
    }
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
    proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_68);
    goto LAB_009d5f84;
  }
  local_c0._0_4_ = 0x7b;
  pMVar3 = ExtensionSet::GetMessage
                     ((ExtensionSet *)local_58,
                      proto2_unittest::TestMessageSetExtension1::message_set_extension,
                      (MessageLite *)PTR__TestMessageSetExtension1_default_instance__01971590);
  local_d0._M_head_impl._0_4_ = (int)pMVar3[2]._internal_metadata_.ptr_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_98,"123",
             "message_set .GetExtension( TestMessageSetExtension1::message_set_extension) .i()",
             (int *)local_c0,(int *)&local_d0);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_90.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = *(char **)IStack_90.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x5a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)CONCAT44(local_c0._4_4_,local_c0._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0._4_4_,local_c0._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_90.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&IStack_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_90.ptr_
                );
  }
  ExtensionSet::ClearExtension
            ((ExtensionSet *)local_58,
             proto2_unittest::TestMessageSetExtension1::message_set_extension);
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_98,(MessageLite *)local_68);
  pcVar4 = anon_var_dwarf_a22956 + 5;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)local_c0,"message_set.SerializeAsString()","\"\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (char (*) [1])(anon_var_dwarf_a22956 + 5));
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,
                    (ulong)((long)&((local_88._impl_._extensions_.arena_)->impl_).tag_and_id_ + 1));
  }
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x5f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_98 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_68);
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet
            ((TestMessageSet *)local_98,(Arena *)0x0);
  local_68._0_8_ = (data->_M_dataplus)._M_p;
  local_58._8_4_ = (undefined4)data->_M_string_length;
  local_68._8_8_ = local_68._0_8_ + (long)(int)local_58._8_4_;
  local_58._0_8_ = (Arena *)0x0;
  local_58._12_7_ = 0;
  local_58[0x13] = 0;
  local_58[0x14] = '\0';
  local_58._21_2_ = 0;
  local_58._28_4_ = 0;
  local_58._32_4_ = 0x7fffffff;
  local_58._36_4_ = io::CodedInputStream::default_recursion_limit_;
  local_30 = io::CodedInputStream::default_recursion_limit_;
  local_28 = (DescriptorPool *)0x0;
  pMStack_20 = (MessageFactory *)0x0;
  local_58._24_4_ = local_58._8_4_;
  iVar2 = (internal)
          WireFormat::ParseAndMergePartial((CodedInputStream *)local_68,(Message *)local_98);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)iVar2) {
    local_d0._M_head_impl._0_1_ = iVar2;
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c0,(internal *)&local_d0,
               (AssertionResult *)"WireFormat::ParseAndMergePartial(&input, &message_set)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x66,(char *)CONCAT44(local_c0._4_4_,local_c0._0_4_));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_c0._4_4_,local_c0._0_4_) != &local_b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_c0._4_4_,local_c0._0_4_),local_b0._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) + 8))();
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
  }
  local_d0._M_head_impl._0_1_ = local_58[0x14];
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58[0x14] == '\0') {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c0,(internal *)&local_d0,(AssertionResult *)0x1200949,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x67,(char *)CONCAT44(local_c0._4_4_,local_c0._0_4_));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_c0._4_4_,local_c0._0_4_) != &local_b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_c0._4_4_,local_c0._0_4_),local_b0._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,(int32_t)local_e0.data_) + 8))();
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
  }
  local_d0._M_head_impl._0_4_ = 0x7b;
  pMVar3 = ExtensionSet::GetMessage
                     (&local_88._impl_._extensions_,
                      proto2_unittest::TestMessageSetExtension1::message_set_extension,
                      (MessageLite *)PTR__TestMessageSetExtension1_default_instance__01971590);
  local_e0.data_._0_4_ = (int32_t)pMVar3[2]._internal_metadata_.ptr_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c0,"123",
             "message_set .GetExtension( TestMessageSetExtension1::message_set_extension) .i()",
             (int *)&local_d0,(int *)&local_e0);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x6c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_68);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_98);
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_68);
  MVar5 = proto2_wireformat_unittest::TestMessageSet::GetMetadata
                    ((TestMessageSet *)proto2_wireformat_unittest::_TestMessageSet_default_instance_
                    );
  pMVar3 = &DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)local_68,MVar5.descriptor)
            ->super_MessageLite;
  pMVar3 = MessageLite::New(pMVar3,(Arena *)0x0);
  data_01._M_str = (data->_M_dataplus)._M_p;
  data_01._M_len = data->_M_string_length;
  MessageLite::ParseFromString(pMVar3,data_01);
  MVar5 = Message::GetMetadata((Message *)pMVar3);
  local_98 = (undefined1  [8])0x0;
  IStack_90.ptr_ = 0;
  local_88._impl_._extensions_.arena_ = (Arena *)0x0;
  Reflection::ListFields
            (MVar5.reflection,(Message *)pMVar3,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_98);
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (IStack_90.ptr_ - (long)local_98 >> 3);
  local_e0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c0,"fields.size()","1",(unsigned_long *)&local_d0,(int *)&local_e0);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x77,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d0);
LAB_009d5f29:
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  else {
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
    this_00 = Reflection::GetMessage
                        (MVar5.reflection,(Message *)pMVar3,*(FieldDescriptor **)local_98,
                         (MessageFactory *)0x0);
    MVar5 = Message::GetMetadata(this_00);
    local_d0._M_head_impl._0_4_ = 0x7b;
    MVar6 = Message::GetMetadata(this_00);
    name._M_str = "i";
    name._M_len = 1;
    field = Descriptor::FindFieldByName(MVar6.descriptor,name);
    local_e0.data_._0_4_ = Reflection::GetInt32(MVar5.reflection,this_00,field);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_c0,"123",
               "reflection->GetInt32( sub, sub.GetDescriptor()->FindFieldByName(\"i\"))",
               (int *)&local_d0,(int *)&local_e0);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_b8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x7b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d0);
      goto LAB_009d5f29;
    }
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  if (local_98 != (undefined1  [8])0x0) {
    operator_delete((void *)local_98,(long)local_88._impl_._extensions_.arena_ - (long)local_98);
  }
  (*pMVar3->_vptr_MessageLite[1])(pMVar3);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_68);
LAB_009d5f84:
  testing::ScopedTrace::~ScopedTrace(&local_d1);
  return;
}

Assistant:

void ValidateTestMessageSet(const std::string& test_case,
                              const std::string& data) {
    SCOPED_TRACE(test_case);
    {
      TestMessageSet message_set;
      ASSERT_TRUE(message_set.ParseFromString(data));

      EXPECT_EQ(123, message_set
                         .GetExtension(
                             TestMessageSetExtension1::message_set_extension)
                         .i());

      // Make sure it does not contain anything else.
      message_set.ClearExtension(
          TestMessageSetExtension1::message_set_extension);
      EXPECT_EQ(message_set.SerializeAsString(), "");
    }
    {
      // Test parse the message via Reflection.
      TestMessageSet message_set;
      io::CodedInputStream input(reinterpret_cast<const uint8_t*>(data.data()),
                                 data.size());
      EXPECT_TRUE(WireFormat::ParseAndMergePartial(&input, &message_set));
      EXPECT_TRUE(input.ConsumedEntireMessage());

      EXPECT_EQ(123, message_set
                         .GetExtension(
                             TestMessageSetExtension1::message_set_extension)
                         .i());
    }
    {
      // Test parse the message via DynamicMessage.
      DynamicMessageFactory factory;
      std::unique_ptr<Message> msg(
          factory.GetPrototype(TestMessageSet::descriptor())->New());
      msg->ParseFromString(data);
      auto* reflection = msg->GetReflection();
      std::vector<const FieldDescriptor*> fields;
      reflection->ListFields(*msg, &fields);
      ASSERT_EQ(fields.size(), 1);
      const auto& sub = reflection->GetMessage(*msg, fields[0]);
      reflection = sub.GetReflection();
      EXPECT_EQ(123, reflection->GetInt32(
                         sub, sub.GetDescriptor()->FindFieldByName("i")));
    }
  }